

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O2

char * make_dirname(char *pi_name,char **logtext)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char *dirname;
  ssize_t sVar4;
  ssh_hash *psVar5;
  int *piVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  char *fmt;
  int iVar13;
  uchar digest [32];
  uchar saltbuf [64];
  char retbuf [65];
  
  pcVar3 = get_username();
  dirname = dupprintf("%s.%s","/tmp/putty-connshare",pcVar3);
  safefree(pcVar3);
  if (*dirname != '/') {
    __assert_fail("*parent == \'/\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/sharing.c"
                  ,0x24,"char *make_parentdir_name(void)");
  }
  pcVar3 = make_dir_and_check_ours(dirname);
  if (pcVar3 != (char *)0x0) {
    *logtext = pcVar3;
    goto LAB_00137bd8;
  }
  iVar10 = 0;
  pcVar3 = dupprintf("%s/%s",dirname,"salt");
  iVar1 = open(pcVar3,0);
  if (-1 < iVar1) {
LAB_00137c39:
    while( true ) {
      if (0x3f < iVar10) {
        close(iVar1);
        safefree(pcVar3);
        psVar5 = sha256_select(&ssh_sha256);
        if (psVar5 != (ssh_hash *)0x0) {
          (*psVar5->vt->reset)(psVar5);
        }
        BinarySink_put_string(psVar5->binarysink_,saltbuf,0x40);
        BinarySink_put_stringz(psVar5->binarysink_,pi_name);
        (*psVar5->vt->digest)(psVar5,digest);
        (*psVar5->vt->free)(psVar5);
        pcVar3 = retbuf;
        for (lVar11 = 0; lVar11 != 0x20; lVar11 = lVar11 + 1) {
          sprintf(pcVar3,"%02x",(ulong)digest[lVar11]);
          pcVar3 = pcVar3 + 2;
        }
        pcVar3 = dupstr(retbuf);
        smemclr(saltbuf,0x40);
        pcVar7 = dupprintf("%s/%s",dirname,pcVar3);
        safefree(dirname);
        safefree(pcVar3);
        return pcVar7;
      }
      sVar4 = read(iVar1,saltbuf,0x40);
      uVar2 = (uint)sVar4;
      if ((int)uVar2 < 1) break;
      if (0x40U - iVar10 < uVar2) {
        __assert_fail("0 < ret && ret <= SALT_SIZE - i",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/sharing.c"
                      ,0xcb,"char *make_dirname(const char *, char **)");
      }
      iVar10 = iVar10 + uVar2 + 1;
    }
    close(iVar1);
    if (uVar2 == 0) {
      pcVar7 = "unexpected EOF";
    }
    else {
      piVar6 = __errno_location();
      pcVar7 = strerror(*piVar6);
    }
    pcVar7 = dupprintf("%s: read: %s",pcVar3,pcVar7);
    *logtext = pcVar7;
    safefree(pcVar3);
    goto LAB_00137bd8;
  }
  piVar6 = __errno_location();
  if (*piVar6 != 2) {
    pcVar7 = strerror(*piVar6);
    pcVar7 = dupprintf("%s: open: %s",pcVar3,pcVar7);
    *logtext = pcVar7;
    safefree(pcVar3);
    goto LAB_00137bd8;
  }
  uVar2 = getpid();
  uVar12 = 0;
  while( true ) {
    pcVar7 = dupprintf("%s/%s.tmp.%d.%d",dirname,"salt",(ulong)uVar2,(ulong)uVar12);
    iVar1 = open(pcVar7,0xc1,0x100);
    if (-1 < iVar1) break;
    if (*piVar6 != 0x11) {
      pcVar8 = strerror(*piVar6);
      pcVar8 = dupprintf("%s: open: %s",pcVar7,pcVar8);
      *logtext = pcVar8;
      safefree(pcVar7);
      safefree(pcVar3);
      goto LAB_00137bd8;
    }
    safefree(pcVar7);
    uVar12 = uVar12 + 1;
  }
  random_read(saltbuf,0x40);
  sVar4 = write(iVar1,saltbuf,0x40);
  iVar13 = (int)sVar4;
  if (iVar13 != 0x40 && -1 < iVar13) {
    __assert_fail("ret < 0 || ret == SALT_SIZE",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/sharing.c"
                  ,0x80,"char *make_dirname(const char *, char **)");
  }
  iVar1 = close(iVar1);
  pcVar8 = pcVar7;
  if (iVar13 < 0) {
    pcVar9 = strerror(*piVar6);
    fmt = "%s: write: %s";
LAB_00137fa6:
    pcVar8 = dupprintf(fmt,pcVar8,pcVar9);
    *logtext = pcVar8;
    safefree(pcVar7);
  }
  else {
    if (iVar1 < 0) {
      pcVar9 = strerror(*piVar6);
      fmt = "%s: close: %s";
      goto LAB_00137fa6;
    }
    iVar1 = link(pcVar7,pcVar3);
    if ((iVar1 < 0) && (*piVar6 != 0x11)) {
      pcVar9 = strerror(*piVar6);
      fmt = "%s: link: %s";
      pcVar8 = pcVar3;
      goto LAB_00137fa6;
    }
    iVar1 = unlink(pcVar7);
    if (iVar1 < 0) {
      pcVar9 = strerror(*piVar6);
      fmt = "%s: unlink: %s";
      goto LAB_00137fa6;
    }
    safefree(pcVar7);
    iVar1 = open(pcVar3,0);
    if (-1 < iVar1) goto LAB_00137c39;
    pcVar7 = strerror(*piVar6);
    pcVar7 = dupprintf("%s: open: %s",pcVar3,pcVar7);
    *logtext = pcVar7;
  }
  safefree(pcVar3);
LAB_00137bd8:
  safefree(dirname);
  return (char *)0x0;
}

Assistant:

static char *make_dirname(const char *pi_name, char **logtext)
{
    char *name, *parentdirname, *dirname, *err;

    /*
     * First, create the top-level directory for all shared PuTTY
     * connections owned by this user.
     */
    parentdirname = make_parentdir_name();
    if ((err = make_dir_and_check_ours(parentdirname)) != NULL) {
        *logtext = err;
        sfree(parentdirname);
        return NULL;
    }

    /*
     * Transform the platform-independent version of the connection
     * identifier into the name we'll actually use for the directory
     * containing the Unix socket.
     *
     * We do this by hashing the identifier with some user-specific
     * secret information, to avoid the privacy leak of having
     * "user@host" strings show up in 'netstat -x'. (Irritatingly, the
     * full pathname of a Unix-domain socket _does_ show up in the
     * 'netstat -x' output, at least on Linux, even if that socket is
     * in a directory not readable to the user running netstat. You'd
     * think putting things inside an 0700 directory would hide their
     * names from other users, but no.)
     *
     * The secret information we use to salt the hash lives in a file
     * inside the top-level directory we just created, so we must
     * first create that file (with some fresh random data in it) if
     * it's not already been done by a previous PuTTY.
     */
    {
        unsigned char saltbuf[SALT_SIZE];
        char *saltname;
        int saltfd, i, ret;

        saltname = dupprintf("%s/%s", parentdirname, SALT_FILENAME);
        saltfd = open(saltname, O_RDONLY);
        if (saltfd < 0) {
            char *tmpname;
            int pid;

            if (errno != ENOENT) {
                *logtext = dupprintf("%s: open: %s", saltname,
                                     strerror(errno));
                sfree(saltname);
                sfree(parentdirname);
                return NULL;
            }

            /*
             * The salt file doesn't already exist, so try to create
             * it. Another process may be attempting the same thing
             * simultaneously, so we must do this carefully: we write
             * a salt file under a different name, then hard-link it
             * into place, which guarantees that we won't change the
             * contents of an existing salt file.
             */
            pid = getpid();
            for (i = 0;; i++) {
                tmpname = dupprintf("%s/%s.tmp.%d.%d",
                                    parentdirname, SALT_FILENAME, pid, i);
                saltfd = open(tmpname, O_WRONLY | O_EXCL | O_CREAT, 0400);
                if (saltfd >= 0)
                    break;
                if (errno != EEXIST) {
                    *logtext = dupprintf("%s: open: %s", tmpname,
                                         strerror(errno));
                    sfree(tmpname);
                    sfree(saltname);
                    sfree(parentdirname);
                    return NULL;
                }
                sfree(tmpname);        /* go round and try again with i+1 */
            }
            /*
             * Invent some random data.
             */
            random_read(saltbuf, SALT_SIZE);
            ret = write(saltfd, saltbuf, SALT_SIZE);
            /* POSIX atomicity guarantee: because we wrote less than
             * PIPE_BUF bytes, the write either completed in full or
             * failed. */
            assert(SALT_SIZE < PIPE_BUF);
            assert(ret < 0 || ret == SALT_SIZE);
            if (ret < 0) {
                close(saltfd);
                *logtext = dupprintf("%s: write: %s", tmpname,
                                     strerror(errno));
                sfree(tmpname);
                sfree(saltname);
                sfree(parentdirname);
                return NULL;
            }
            if (close(saltfd) < 0) {
                *logtext = dupprintf("%s: close: %s", tmpname,
                                     strerror(errno));
                sfree(tmpname);
                sfree(saltname);
                sfree(parentdirname);
                return NULL;
            }

            /*
             * Now attempt to hard-link our temp file into place. We
             * tolerate EEXIST as an outcome, because that just means
             * another PuTTY got their attempt in before we did (and
             * we only care that there is a valid salt file we can
             * agree on, no matter who created it).
             */
            if (link(tmpname, saltname) < 0 && errno != EEXIST) {
                *logtext = dupprintf("%s: link: %s", saltname,
                                     strerror(errno));
                sfree(tmpname);
                sfree(saltname);
                sfree(parentdirname);
                return NULL;
            }

            /*
             * Whether that succeeded or not, get rid of our temp file.
             */
            if (unlink(tmpname) < 0) {
                *logtext = dupprintf("%s: unlink: %s", tmpname,
                                     strerror(errno));
                sfree(tmpname);
                sfree(saltname);
                sfree(parentdirname);
                return NULL;
            }

            /*
             * And now we've arranged for there to be a salt file, so
             * we can try to open it for reading again and this time
             * expect it to work.
             */
            sfree(tmpname);

            saltfd = open(saltname, O_RDONLY);
            if (saltfd < 0) {
                *logtext = dupprintf("%s: open: %s", saltname,
                                     strerror(errno));
                sfree(saltname);
                sfree(parentdirname);
                return NULL;
            }
        }

        for (i = 0; i < SALT_SIZE; i++) {
            ret = read(saltfd, saltbuf, SALT_SIZE);
            if (ret <= 0) {
                close(saltfd);
                *logtext = dupprintf("%s: read: %s", saltname,
                                     ret == 0 ? "unexpected EOF" :
                                     strerror(errno));
                sfree(saltname);
                sfree(parentdirname);
                return NULL;
            }
            assert(0 < ret && ret <= SALT_SIZE - i);
            i += ret;
        }

        close(saltfd);
        sfree(saltname);

        /*
         * Now we've got our salt, hash it with the connection
         * identifier to produce our actual socket name.
         */
        {
            unsigned char digest[32];
            char retbuf[65];

            ssh_hash *h = ssh_hash_new(&ssh_sha256);
            put_string(h, saltbuf, SALT_SIZE);
            put_stringz(h, pi_name);
            ssh_hash_final(h, digest);

            /*
             * And make it printable.
             */
            for (i = 0; i < 32; i++) {
                sprintf(retbuf + 2*i, "%02x", digest[i]);
                /* the last of those will also write the trailing NUL */
            }

            name = dupstr(retbuf);
        }

        smemclr(saltbuf, sizeof(saltbuf));
    }

    dirname = dupprintf("%s/%s", parentdirname, name);
    sfree(parentdirname);
    sfree(name);

    return dirname;
}